

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarmonicTorsionType.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,HarmonicTorsionType *htt)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"This HarmonicTorsionType has below form:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(htt->d0_);
  std::operator<<(poVar1,"*(phi - ");
  poVar1 = std::ostream::_M_insert<double>(htt->phi0_);
  poVar1 = std::operator<<(poVar1,")/2");
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HarmonicTorsionType& htt) {
    os << "This HarmonicTorsionType has below form:" << std::endl;
    os << htt.d0_ << "*(phi - " << htt.phi0_ << ")/2" << std::endl;
    return os;
  }